

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevolute::IntStateScatterReactions
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar33;
  double *pdVar34;
  ChBodyFrame *pCVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_70;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> local_60;
  
  iVar36 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if ((char)iVar36 == '\0') {
    return;
  }
  uVar33 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < (long)uVar33) {
    pdVar34 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = pdVar34[off_L];
    this->m_multipliers[0] = pdVar34[off_L];
    if (off_L + 1 < uVar33) {
      dVar44 = pdVar34[off_L + 1];
      this->m_multipliers[1] = dVar44;
      if (off_L + 2 < uVar33) {
        auVar52._8_8_ = 0;
        auVar52._0_8_ = pdVar34[off_L + 2];
        this->m_multipliers[2] = pdVar34[off_L + 2];
        if (off_L + 3 < uVar33) {
          dVar1 = pdVar34[off_L + 3];
          this->m_multipliers[3] = dVar1;
          if (off_L + 4 < uVar33) {
            dVar2 = pdVar34[off_L + 4];
            this->m_multipliers[4] = dVar2;
            pCVar35 = (this->super_ChLink).Body2;
            local_70 = &(pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar45._8_8_ = 0;
            auVar45._0_8_ =
                 dVar44 * (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar17 = vfmadd231sd_fma(auVar45,auVar37,auVar17);
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar63._8_8_ = 0;
            auVar63._0_8_ =
                 dVar44 * (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar18 = vfmadd231sd_fma(auVar63,auVar37,auVar18);
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar60._8_8_ = 0;
            auVar60._0_8_ =
                 dVar44 * (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar37 = vfmadd231sd_fma(auVar60,auVar37,auVar19);
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar17 = vfmadd231sd_fma(auVar17,auVar52,auVar20);
            auVar21._8_8_ = 0;
            auVar21._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar18 = vfmadd231sd_fma(auVar18,auVar52,auVar21);
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar52 = vfmadd231sd_fma(auVar37,auVar52,auVar22);
            dVar44 = auVar17._0_8_;
            auVar23._8_8_ = 0;
            auVar23._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar37 = vfmadd231sd_fma(auVar38,auVar18,auVar23);
            auVar46._0_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar46._8_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar53._8_8_ = auVar18._0_8_;
            auVar53._0_8_ = auVar18._0_8_;
            auVar24._8_8_ = 0;
            auVar24._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar17 = vfmadd231sd_fma(auVar37,auVar52,auVar24);
            auVar37 = vfmadd132pd_fma(auVar53,auVar46,
                                      *(undefined1 (*) [16])
                                       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array);
            auVar47._8_8_ = auVar52._0_8_;
            auVar47._0_8_ = auVar52._0_8_;
            auVar37 = vfmadd132pd_fma(auVar47,auVar37,
                                      *(undefined1 (*) [16])
                                       ((this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>
                                        .
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data.array + 6));
            *(undefined1 (*) [16])(this->super_ChLink).react_force.m_data = auVar37;
            (this->super_ChLink).react_force.m_data[2] = auVar17._0_8_;
            dVar44 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[3];
            dVar3 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[6];
            pCVar35 = (this->super_ChLink).Body1;
            dVar4 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0];
            dVar5 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0];
            dVar6 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
            dVar7 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2];
            dVar8 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
            dVar9 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
            dVar10 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
            dVar11 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
            dVar12 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
            dVar13 = (pCVar35->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
            dVar14 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
            local_68 = &this->m_w2_tilde;
            dVar15 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4];
            dVar16 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
            ChMatrix33<double>::
            ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                      (&local_60,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                        *)&local_70);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = dVar4;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = dVar11;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = dVar14;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar3;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = dVar13;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = dVar16;
            auVar71._8_8_ = 0;
            auVar71._0_8_ = dVar5;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = dVar7;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar44 * dVar12;
            auVar37 = vfmadd231sd_fma(auVar39,auVar64,auVar54);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar15 * dVar12;
            auVar52 = vfmadd231sd_fma(auVar48,auVar69,auVar64);
            auVar37 = vfmadd231sd_fma(auVar37,auVar68,auVar67);
            auVar52 = vfmadd231sd_fma(auVar52,auVar70,auVar68);
            dVar3 = dVar1 * auVar37._0_8_ + dVar2 * auVar52._0_8_;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = dVar6 * dVar44;
            auVar37 = vfmadd231sd_fma(auVar49,auVar71,auVar54);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = dVar6 * dVar15;
            auVar52 = vfmadd231sd_fma(auVar55,auVar69,auVar71);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = dVar10;
            auVar37 = vfmadd231sd_fma(auVar37,auVar73,auVar67);
            auVar52 = vfmadd231sd_fma(auVar52,auVar70,auVar73);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = dVar8;
            dVar4 = dVar1 * auVar37._0_8_ + dVar2 * auVar52._0_8_;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = dVar9 * dVar44;
            auVar37 = vfmadd231sd_fma(auVar56,auVar74,auVar54);
            auVar37 = vfmadd231sd_fma(auVar37,auVar72,auVar67);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = dVar9 * dVar15;
            auVar52 = vfmadd231sd_fma(auVar61,auVar74,auVar69);
            auVar52 = vfmadd231sd_fma(auVar52,auVar72,auVar70);
            dVar44 = dVar1 * auVar37._0_8_ + dVar2 * auVar52._0_8_;
            auVar25._8_8_ = 0;
            auVar25._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar4;
            auVar57._8_8_ = 0;
            auVar57._0_8_ =
                 dVar44 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar37 = vfmadd231sd_fma(auVar57,auVar50,auVar25);
            auVar26._8_8_ = 0;
            auVar26._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar65._8_8_ = 0;
            auVar65._0_8_ =
                 dVar44 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar52 = vfmadd231sd_fma(auVar65,auVar50,auVar26);
            auVar27._8_8_ = 0;
            auVar27._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar51._8_8_ = 0;
            auVar51._0_8_ = dVar4;
            auVar62._8_8_ = 0;
            auVar62._0_8_ =
                 dVar44 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar17 = vfmadd231sd_fma(auVar62,auVar51,auVar27);
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar40._8_8_ = 0;
            auVar40._0_8_ = dVar3;
            auVar37 = vfmadd231sd_fma(auVar37,auVar40,auVar28);
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar52 = vfmadd231sd_fma(auVar52,auVar40,auVar29);
            auVar30._8_8_ = 0;
            auVar30._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar41._8_8_ = 0;
            auVar41._0_8_ = dVar3;
            auVar17 = vfmadd231sd_fma(auVar17,auVar41,auVar30);
            dVar44 = auVar37._0_8_;
            auVar31._8_8_ = 0;
            auVar31._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar42._8_8_ = 0;
            auVar42._0_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar37 = vfmadd231sd_fma(auVar42,auVar52,auVar31);
            auVar58._0_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar58._8_8_ =
                 dVar44 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar66._0_8_ = auVar52._0_8_;
            auVar66._8_8_ = auVar66._0_8_;
            auVar32._8_8_ = 0;
            auVar32._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar52 = vfmadd231sd_fma(auVar37,auVar17,auVar32);
            auVar37 = vfmadd132pd_fma(auVar66,auVar58,
                                      *(undefined1 (*) [16])
                                       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array);
            auVar59._8_8_ = auVar17._0_8_;
            auVar59._0_8_ = auVar17._0_8_;
            auVar37 = vfmadd132pd_fma(auVar59,auVar37,
                                      *(undefined1 (*) [16])
                                       ((this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>
                                        .
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data.array + 6));
            auVar43._0_8_ = auVar52._0_8_ ^ 0x8000000000000000;
            auVar43._8_8_ = auVar52._8_8_ ^ 0x8000000000000000;
            (this->super_ChLink).react_torque.m_data[0] = -auVar37._0_8_;
            (this->super_ChLink).react_torque.m_data[1] = -auVar37._8_8_;
            dVar44 = (double)vmovlpd_avx(auVar43);
            (this->super_ChLink).react_torque.m_data[2] = dVar44;
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkRevolute::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);
    m_multipliers[4] = L(off_L + 4);

    // Also compute 'intuitive' reactions:
    ChVector<> lam_sph(m_multipliers[0], m_multipliers[1], m_multipliers[2]);
    double lam_uw = m_multipliers[3];
    double lam_vw = m_multipliers[4];

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the revolute joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(w2') *A_2^T * (u1 * lam_uw + v1 * lam_vw)
    //     = -C^T * [A_2 * tilde(w2')]^T * (u1 * lam_uw + v1 * lam_vw)

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChVector<> v1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Yaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_w2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_uw * u1 + lam_vw * v1);
    react_torque = -(m_frame2.GetA().transpose() * T2);
}